

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O2

double __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<double>
          (SPFForceManager *this,double quantityA,double quantityB)

{
  double dVar1;
  double dVar2;
  pointer local_20;
  
  Snapshot::getSPFData((Snapshot *)&stack0xffffffffffffffe0);
  dVar1 = pow(local_20[1].super_Vector<double,_3U>.data_[0],(double)this->k_);
  dVar2 = 1.0;
  if (dVar1 <= 1.0) {
    dVar2 = dVar1;
  }
  dVar2 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return (1.0 - dVar2) * quantityA + dVar2 * quantityB;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }